

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMMapping.c
# Opt level: O1

_Bool ARM_rel_branch(cs_struct *h,uint id)

{
  uint *puVar1;
  bool bVar2;
  long lVar3;
  
  bVar2 = true;
  if (id != 0x3a) {
    lVar3 = 1;
    do {
      bVar2 = lVar3 != 0xd;
      if (lVar3 == 0xd) {
        return bVar2;
      }
      puVar1 = insn_rel + lVar3;
      lVar3 = lVar3 + 1;
    } while (*puVar1 != id);
  }
  return bVar2;
}

Assistant:

bool ARM_rel_branch(cs_struct *h, unsigned int id)
{
	int i;

	for (i = 0; insn_rel[i]; i++) {
		if (id == insn_rel[i]) {
			return true;
		}
	}

	// not found
	return false;
}